

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_json_array_subdoc(void)

{
  char cVar1;
  int iVar2;
  int __fd;
  void *__buf;
  void *__buf_00;
  void *__s1;
  void *__s2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  uint uVar6;
  char *pcVar7;
  uint uVar8;
  bson_t compare;
  bson_t b;
  bson_t subdoc;
  bson_error_t error;
  undefined1 local_480 [4];
  uint local_47c;
  undefined1 local_400 [4];
  uint local_3fc;
  undefined1 local_380 [200];
  undefined1 local_2b8 [8];
  undefined1 local_2b0 [640];
  
  bson_init(local_480);
  bson_init(local_380);
  bson_append_int32(local_380,"a",1,0x7b);
  bson_append_document(local_480,"0",1,local_380);
  cVar1 = bson_init_from_json(local_400,"[ { \"a\" : 123 } ]",0xffffffffffffffff,local_2b8);
  if (cVar1 == '\0') {
    fprintf(_stderr,"%s\n",local_2b0);
    pcVar7 = "r";
    uVar3 = 0x978;
  }
  else {
    __buf = (void *)bson_get_data(local_400);
    __buf_00 = (void *)bson_get_data(local_480);
    if (local_47c == local_3fc) {
      __s1 = (void *)bson_get_data(local_480);
      __s2 = (void *)bson_get_data(local_400);
      iVar2 = bcmp(__s1,__s2,(ulong)local_47c);
      if (iVar2 == 0) {
        bson_destroy(local_480);
        bson_destroy(local_400);
        return;
      }
    }
    uVar3 = bson_as_canonical_extended_json(local_400,0);
    uVar4 = bson_as_canonical_extended_json(local_480,0);
    uVar8 = 0;
    uVar6 = local_47c;
    if (local_3fc < local_47c) {
      uVar8 = 0;
      uVar6 = local_3fc;
    }
    for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      if (*(char *)((long)__buf + (ulong)uVar8) != *(char *)((long)__buf_00 + (ulong)uVar8))
      goto LAB_0012113b;
    }
    uVar8 = local_3fc;
    if (local_3fc < local_47c) {
      uVar8 = local_47c;
    }
    uVar8 = uVar8 - 1;
LAB_0012113b:
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar8,uVar3,uVar4);
    iVar2 = open("failure.bad.bson",0x42,0x1a0);
    __fd = open("failure.expected.bson",0x42,0x1a0);
    if (iVar2 == -1) {
      pcVar7 = "fd1 != -1";
    }
    else if (__fd == -1) {
      pcVar7 = "fd2 != -1";
    }
    else {
      uVar5 = write(iVar2,__buf,(ulong)local_3fc);
      if (uVar5 == local_3fc) {
        uVar5 = write(__fd,__buf_00,(ulong)local_47c);
        if (uVar5 == local_47c) {
          close(iVar2);
          close(__fd);
          pcVar7 = "0";
        }
        else {
          pcVar7 = "(&compare)->len == bson_write (fd2, expected_data, (&compare)->len)";
        }
      }
      else {
        pcVar7 = "(&b)->len == bson_write (fd1, bson_data, (&b)->len)";
      }
    }
    uVar3 = 0x97a;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar3,"test_bson_json_array_subdoc",pcVar7);
  abort();
}

Assistant:

static void
test_bson_json_array_subdoc (void)
{
   bson_error_t error;
   const char *json = "[ { \"a\" : 123 } ]";
   bson_t b, compare, subdoc;
   bool r;

   bson_init (&compare);
   bson_init (&subdoc);
   bson_append_int32 (&subdoc, "a", 1, 123);
   bson_append_document (&compare, "0", 1, &subdoc);

   r = bson_init_from_json (&b, json, -1, &error);
   if (!r)
      fprintf (stderr, "%s\n", error.message);
   BSON_ASSERT (r);

   bson_eq_bson (&b, &compare);
   bson_destroy (&compare);
   bson_destroy (&b);
}